

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O2

filename_t * __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::filename_abi_cxx11_
          (filename_t *__return_storage_ptr__,rotating_file_sink<std::mutex> *this)

{
  mutex *__mutex;
  
  __mutex = &(this->super_base_sink<std::mutex>).mutex_;
  CLI::std::mutex::lock(__mutex);
  std::__cxx11::string::string((string *)__return_storage_ptr__,&(this->file_helper_).filename_);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::filename() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    return file_helper_.filename();
}